

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::PushCall(Thread *this,DefinedFunc *func,Ptr *out_trap)

{
  Store *pSVar1;
  size_type sVar2;
  size_type sVar3;
  Instance *pIVar4;
  Module *pMVar5;
  FuncDesc *pFVar6;
  size_type local_b8;
  Ref local_b0;
  size_t local_a8;
  RefPtr<wabt::interp::Module> local_a0;
  size_t local_88;
  RefPtr<wabt::interp::Instance> local_80;
  allocator local_61;
  string local_60;
  Ptr local_40;
  Ptr *local_28;
  Ptr *out_trap_local;
  DefinedFunc *func_local;
  Thread *this_local;
  
  local_28 = out_trap;
  out_trap_local = (Ptr *)func;
  func_local = (DefinedFunc *)this;
  sVar2 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::size
                    (&this->frames_);
  sVar3 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::capacity
                    (&this->frames_);
  if (sVar2 == sVar3) {
    pSVar1 = this->store_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"call stack exhausted",&local_61);
    Trap::New(&local_40,pSVar1,&local_60,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=(local_28,&local_40);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  else {
    pSVar1 = this->store_;
    local_88 = (size_t)DefinedFunc::instance((DefinedFunc *)out_trap_local);
    Store::UnsafeGet<wabt::interp::Instance>(&local_80,pSVar1,(Ref)local_88);
    pIVar4 = RefPtr<wabt::interp::Instance>::get(&local_80);
    this->inst_ = pIVar4;
    RefPtr<wabt::interp::Instance>::~RefPtr(&local_80);
    pSVar1 = this->store_;
    local_a8 = (size_t)Instance::module(this->inst_);
    Store::UnsafeGet<wabt::interp::Module>(&local_a0,pSVar1,(Ref)local_a8);
    pMVar5 = RefPtr<wabt::interp::Module>::get(&local_a0);
    this->mod_ = pMVar5;
    RefPtr<wabt::interp::Module>::~RefPtr(&local_a0);
    local_b0 = Object::self((Object *)out_trap_local);
    local_b8 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                         (&this->values_);
    pFVar6 = DefinedFunc::desc((DefinedFunc *)out_trap_local);
    std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>::
    emplace_back<wabt::interp::Ref,unsigned_long,unsigned_int_const&,wabt::interp::Instance*&,wabt::interp::Module*&>
              ((vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>> *)&this->frames_,
               &local_b0,&local_b8,&pFVar6->code_offset,&this->inst_,&this->mod_);
    this_local._4_4_ = Ok;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::PushCall(const DefinedFunc& func, Trap::Ptr* out_trap) {
  TRAP_IF(frames_.size() == frames_.capacity(), "call stack exhausted");
  inst_ = store_.UnsafeGet<Instance>(func.instance()).get();
  mod_ = store_.UnsafeGet<Module>(inst_->module()).get();
  frames_.emplace_back(func.self(), values_.size(), func.desc().code_offset,
                       inst_, mod_);
  return RunResult::Ok;
}